

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_fseBitCost(FSE_CTable *ctable,uint *count,uint max)

{
  uint uVar1;
  U32 UVar2;
  uint in_EDX;
  long in_RSI;
  uint bitCost;
  uint badCost;
  uint tableLog;
  FSE_CState_t cstate;
  uint s;
  size_t cost;
  uint kAccuracyLog;
  FSE_CTable *in_stack_ffffffffffffffb0;
  FSE_CTable *in_stack_ffffffffffffffb8;
  FSE_CState_t *in_stack_ffffffffffffffc0;
  U32 local_38;
  uint local_2c;
  ulong local_28;
  ulong local_8;
  
  local_28 = 0;
  FSE_initCState(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  uVar1 = ZSTD_getFSEMaxSymbolValue(in_stack_ffffffffffffffb0);
  if (uVar1 < in_EDX) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    for (local_2c = 0; local_2c <= in_EDX; local_2c = local_2c + 1) {
      UVar2 = FSE_bitCost(in_stack_ffffffffffffffc0,local_38,local_2c,8);
      if (*(int *)(in_RSI + (ulong)local_2c * 4) != 0) {
        if ((local_38 + 1) * 0x100 <= UVar2) {
          return 0xffffffffffffffff;
        }
        local_28 = (ulong)*(uint *)(in_RSI + (ulong)local_2c * 4) * (ulong)UVar2 + local_28;
      }
    }
    local_8 = local_28 >> 8;
  }
  return local_8;
}

Assistant:

size_t ZSTD_fseBitCost(
    FSE_CTable const* ctable,
    unsigned const* count,
    unsigned const max)
{
    unsigned const kAccuracyLog = 8;
    size_t cost = 0;
    unsigned s;
    FSE_CState_t cstate;
    FSE_initCState(&cstate, ctable);
    if (ZSTD_getFSEMaxSymbolValue(ctable) < max) {
        DEBUGLOG(5, "Repeat FSE_CTable has maxSymbolValue %u < %u",
                    ZSTD_getFSEMaxSymbolValue(ctable), max);
        return ERROR(GENERIC);
    }
    for (s = 0; s <= max; ++s) {
        unsigned const tableLog = cstate.stateLog;
        unsigned const badCost = (tableLog + 1) << kAccuracyLog;
        unsigned const bitCost = FSE_bitCost(cstate.symbolTT, tableLog, s, kAccuracyLog);
        if (count[s] == 0)
            continue;
        if (bitCost >= badCost) {
            DEBUGLOG(5, "Repeat FSE_CTable has Prob[%u] == 0", s);
            return ERROR(GENERIC);
        }
        cost += (size_t)count[s] * bitCost;
    }
    return cost >> kAccuracyLog;
}